

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_factory_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::subject::
SubjectFactoryTest_test_fx_spot_stream_missing_Quantity_and_currency_Test::
SubjectFactoryTest_test_fx_spot_stream_missing_Quantity_and_currency_Test
          (SubjectFactoryTest_test_fx_spot_stream_missing_Quantity_and_currency_Test *this)

{
  SubjectFactoryTest_test_fx_spot_stream_missing_Quantity_and_currency_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)
       &PTR__SubjectFactoryTest_test_fx_spot_stream_missing_Quantity_and_currency_Test_003d3c18;
  return;
}

Assistant:

TEST(SubjectFactoryTest, test_fx_spot_stream_missing_Quantity_and_currency)
{
    SubjectFactory subject_factory = SubjectFactory(USER_INFO);

    try
    {
        subject_factory.Fx().Quote().Spot()
                .CurrencyPair("EURGBP")
                .LiquidityProvider("CSFX")
                .CreateSubject()
                .ToString().c_str();
    }
    catch (InvalidSubjectException& e)
    {
        ASSERT_STREQ(e.what(), "subject is incomplete, missing: Currency, Quantity");
        return;
    }

    FAIL();
}